

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubic_spline.cpp
# Opt level: O1

PointType __thiscall
CubicInterpolation::at(CubicInterpolation *this,double *t,int *derivative_order)

{
  double *pdVar1;
  Curve<3,_2> CVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  ActualDstType actualDst;
  undefined4 *in_RCX;
  long lVar8;
  double in_XMM1_Qa;
  double dVar9;
  PointType PVar10;
  PointType PVar11;
  PointType PVar12;
  
  switch(*in_RCX) {
  case 0:
    dVar3 = 0.0;
    dVar4 = 0.0;
    (this->super_Curve<3,_2>)._vptr_Curve = (_func_int **)0x0;
    (this->super_Curve<3,_2>).length_ = 0.0;
    in_XMM1_Qa = *(double *)derivative_order;
    dVar9 = 1.0;
    lVar8 = 0;
    do {
      pdVar1 = (double *)((long)t + lVar8 + 0x10);
      dVar3 = dVar3 + dVar9 * *pdVar1;
      dVar4 = dVar4 + dVar9 * pdVar1[1];
      dVar9 = dVar9 * in_XMM1_Qa;
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != 0x40);
    break;
  case 1:
    dVar6 = t[7];
    dVar7 = t[9];
    dVar3 = *(double *)derivative_order;
    dVar9 = (t[6] + t[6]) * dVar3 + t[4];
    dVar4 = t[5];
    PVar12.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
         (_func_int **)(t[8] * 3.0 * dVar3 * dVar3 + dVar9);
    (this->super_Curve<3,_2>)._vptr_Curve =
         PVar12.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
         [1];
    (this->super_Curve<3,_2>).length_ =
         dVar7 * 3.0 * dVar3 * dVar3 + (dVar6 + dVar6) * dVar3 + dVar4;
    PVar12.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
         dVar9;
    return (PointType)
           PVar12.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
           array;
  case 2:
    dVar9 = t[7];
    dVar6 = t[9];
    dVar4 = t[6] + t[6];
    PVar10.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
         t[8] * 6.0;
    dVar3 = *(double *)derivative_order;
    (this->super_Curve<3,_2>)._vptr_Curve =
         (_func_int **)
         (dVar3 * PVar10.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
                  m_data.array[1] + dVar4);
    (this->super_Curve<3,_2>).length_ = dVar3 * dVar6 * 6.0 + dVar9 + dVar9;
    PVar10.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
         dVar4;
    return (PointType)
           PVar10.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
           array;
  case 3:
    dVar3 = t[8] * 6.0;
    dVar4 = t[9] * 6.0;
    break;
  default:
    (this->super_Curve<3,_2>)._vptr_Curve = (_func_int **)0x0;
    (this->super_Curve<3,_2>).length_ = 0.0;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = in_XMM1_Qa;
    return (PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>)(auVar5 << 0x40);
  }
  CVar2.length_._0_4_ = SUB84(dVar4,0);
  CVar2._vptr_Curve = (_func_int **)dVar3;
  CVar2.length_._4_4_ = (int)((ulong)dVar4 >> 0x20);
  this->super_Curve<3,_2> = CVar2;
  PVar11.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
       in_XMM1_Qa;
  PVar11.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
       dVar3;
  return (PointType)
         PVar11.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array;
}

Assistant:

auto CubicInterpolation::at(const double& t, const int& derivative_order) const
    -> CubicInterpolation::PointType {
  switch (derivative_order) {
    case 0: {
      PointType point(0.0, 0.0);
      double tpow = 1.0;
      for (const auto& coeff : coeffs_) {
        point += coeff * tpow;
        tpow *= t;
      }
      return point;
    }
    case 1:
      return coeffs_[1] + 2.0 * coeffs_[2] * t + 3.0 * coeffs_[3] * t * t;
    case 2:
      return 2.0 * coeffs_[2] + 6.0 * coeffs_[3] * t;
    case 3:
      return 6.0 * coeffs_[3];
    default:
      return PointType::Zero();
  }
}